

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestream.cc
# Opt level: O0

void __thiscall google::protobuf::strings::ArrayByteSource::Skip(ArrayByteSource *this,size_t n)

{
  ulong uVar1;
  LogMessage *other;
  LogFinisher local_65 [20];
  byte local_51;
  LogMessage local_50;
  size_t local_18;
  size_t n_local;
  ArrayByteSource *this_local;
  
  local_18 = n;
  n_local = (size_t)this;
  uVar1 = StringPiece::size(&this->input_);
  local_51 = 0;
  if (uVar1 < n) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,"third_party/protobuf-lite/bytestream.cc",0x9d);
    local_51 = 1;
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (n) <= (input_.size()): ");
    internal::LogFinisher::operator=(local_65,other);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  StringPiece::remove_prefix(&this->input_,local_18);
  return;
}

Assistant:

void ArrayByteSource::Skip(size_t n) {
  GOOGLE_DCHECK_LE(n, input_.size());
  input_.remove_prefix(n);
}